

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O3

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  size_t sVar2;
  char *__src;
  ulong __n;
  
  if (n != 0) {
    sVar2 = z->n;
    do {
      if (sVar2 == 0) {
        iVar1 = luaZ_fill(z);
        if (iVar1 == -1) {
          return n;
        }
        sVar2 = z->n + 1;
        z->n = sVar2;
        __src = z->p + -1;
        z->p = __src;
      }
      else {
        __src = z->p;
      }
      __n = sVar2;
      if (n < sVar2) {
        __n = n;
      }
      memcpy(b,__src,__n);
      sVar2 = z->n - __n;
      z->n = sVar2;
      z->p = z->p + __n;
      b = (void *)((long)b + __n);
      n = n - __n;
    } while (n != 0);
  }
  return 0;
}

Assistant:

size_t luaZ_read(ZIO *z, void *b, size_t n) {
    while (n) {
        size_t m;
        if (z->n == 0) {  /* no bytes in buffer? */
            if (luaZ_fill(z) == EOZ)  /* try to read more */
                return n;  /* no more input; return number of missing bytes */
            else {
                z->n++;  /* luaZ_fill consumed first byte; put it back */
                z->p--;
            }
        }
        m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
        memcpy(b, z->p, m);
        z->n -= m;
        z->p += m;
        b = (char *) b + m;
        n -= m;
    }
    return 0;
}